

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeRTASBuilderDestroyExp(ze_rtas_builder_exp_handle_t hBuilder)

{
  ze_pfnRTASBuilderDestroyExp_t pfnDestroyExp;
  ze_result_t result;
  ze_rtas_builder_exp_handle_t hBuilder_local;
  
  pfnDestroyExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c178 != (code *)0x0) {
    pfnDestroyExp._4_4_ = (*DAT_0011c178)(hBuilder);
  }
  return pfnDestroyExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderDestroyExp(
        ze_rtas_builder_exp_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zeDdiTable.RTASBuilderExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hBuilder );
        }
        else
        {
            // generic implementation

        }

        return result;
    }